

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O1

void __thiscall Minisat::ClauseAllocator::reloc(ClauseAllocator *this,CRef *cr,ClauseAllocator *to)

{
  anon_struct_8_10_eb538618_for_header *ps;
  ulong *puVar1;
  anon_struct_8_10_eb538618_for_header aVar2;
  uint *puVar3;
  CRef CVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  ps = (anon_struct_8_10_eb538618_for_header *)
       ((this->super_RegionAllocator<unsigned_int>).memory + *cr);
  if (((ulong)*ps & 0x10) == 0) {
    CVar4 = alloc<Minisat::Clause>(to,(Clause *)ps,SUB41((SUB84(*ps,0) & 4) >> 2,0));
    *cr = CVar4;
    aVar2 = *ps;
    *ps = (anon_struct_8_10_eb538618_for_header)((ulong)aVar2 | 0x10);
    *(CRef *)(ps + 1) = CVar4;
    puVar3 = (to->super_RegionAllocator<unsigned_int>).memory;
    *(ulong *)(puVar3 + *cr) =
         *(ulong *)(puVar3 + *cr) & 0xfffffffffffffffc | (ulong)(aVar2._0_4_ & 3);
    puVar3 = (to->super_RegionAllocator<unsigned_int>).memory;
    puVar1 = (ulong *)(puVar3 + *cr);
    uVar5 = *puVar1;
    if ((uVar5 & 4) == 0) {
      if ((uVar5 & 8) != 0) {
        uVar6 = 0;
        uVar5 = uVar5 >> 0x22;
        if (uVar5 != 0) {
          uVar7 = 0;
          uVar6 = 0;
          do {
            uVar6 = uVar6 | 1 << (*(byte *)((long)puVar1 + uVar7 * 4 + 8) >> 1 & 0x1f);
            uVar7 = uVar7 + 1;
          } while (uVar5 != uVar7);
        }
        *(uint *)((long)puVar1 + uVar5 * 4 + 8) = uVar6;
      }
    }
    else {
      *(undefined4 *)((long)puVar1 + (uVar5 >> 0x22) * 4 + 0xc) =
           *(undefined4 *)(&ps[1].field_0x4 + (*(uint *)&ps->field_0x4 & 0xfffffffc));
      puVar1 = (ulong *)(puVar3 + *cr);
      uVar5 = *puVar1;
      *(undefined4 *)((long)puVar1 + (uVar5 >> 0x22) * 4 + 8) =
           *(undefined4 *)(&ps[1].field_0x0 + (*(uint *)&ps->field_0x4 & 0xfffffffc));
      *puVar1 = uVar5 & 0xffffffffc000001f | (ulong)(SUB84(*ps,0) & 0x3fffffe0);
      puVar3 = (to->super_RegionAllocator<unsigned_int>).memory;
      *(ulong *)(puVar3 + *cr) =
           *(ulong *)(puVar3 + *cr) & 0xffffffff7fffffff | (ulong)(SUB84(*ps,0) & 0x80000000);
      puVar3 = (to->super_RegionAllocator<unsigned_int>).memory;
      *(ulong *)(puVar3 + *cr) =
           *(ulong *)(puVar3 + *cr) & 0xffffffffbfffffff | (ulong)(SUB84(*ps,0) & 0x40000000);
      puVar3 = (to->super_RegionAllocator<unsigned_int>).memory;
      *(ulong *)(puVar3 + *cr) =
           *(ulong *)(puVar3 + *cr) & 0xfffffffeffffffff | (ulong)*ps & 0x100000000;
    }
  }
  else {
    *cr = *(CRef *)(ps + 1);
  }
  return;
}

Assistant:

void reloc(CRef &cr, ClauseAllocator &to)
    {
        Clause &c = operator[](cr);

        if (c.reloced()) {
            cr = c.relocation();
            return;
        }

        cr = to.alloc(c, c.learnt());
        c.relocate(cr);

        // Copy extra data-fields:
        // (This could be cleaned-up. Generalize Clause-constructor to be applicable here instead?)
        to[cr].mark(c.mark());
        if (to[cr].learnt()) {
            to[cr].touched() = c.touched();
            to[cr].activity() = c.activity();
            to[cr].set_lbd(c.lbd());
            to[cr].removable(c.removable());
            to[cr].S(c.S());
            // simplify
            //
            to[cr].setSimplified(c.simplified());
        } else if (to[cr].has_extra())
            to[cr].calcAbstraction();
    }